

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O1

void __thiscall soplex::CLUFactorRational::solveUpdateLeft(CLUFactorRational *this,Rational *vec)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  pointer pnVar8;
  long lVar9;
  int *piVar10;
  Rational x;
  longlong local_80;
  data_type local_78;
  undefined4 local_68;
  undefined2 local_64;
  char local_62;
  ulong local_58;
  void *local_50;
  undefined4 local_48;
  undefined2 local_44;
  char local_42;
  
  local_78.la[0] = 0;
  local_68 = 1;
  local_64 = 0x100;
  local_62 = '\0';
  local_58 = 1;
  local_48 = 1;
  local_44 = 0x100;
  local_42 = '\0';
  piVar4 = (this->l).idx;
  piVar5 = (this->l).start;
  piVar6 = (this->l).row;
  iVar2 = (this->l).firstUpdate;
  lVar9 = (long)(this->l).firstUnused;
  while (iVar2 < lVar9) {
    lVar1 = lVar9 + -1;
    iVar3 = piVar5[lVar1];
    pnVar8 = (this->l).val.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80 = 0;
    boost::
    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
    ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                 *)&local_78.ld,&local_80);
    iVar7 = piVar5[lVar9];
    if (iVar3 < iVar7) {
      piVar10 = piVar4 + iVar3;
      pnVar8 = pnVar8 + iVar3;
      do {
        boost::multiprecision::default_ops::
        eval_multiply_add<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_78.ld,&vec[*piVar10].m_backend,&pnVar8->m_backend);
        pnVar8 = pnVar8 + 1;
        piVar10 = piVar10 + 1;
        iVar7 = iVar7 + -1;
      } while (iVar3 < iVar7);
    }
    boost::
    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator-=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)(vec + piVar6[lVar1]),
                 (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)&local_78.ld);
    lVar9 = lVar1;
  }
  if ((local_44._1_1_ == '\0') && (local_42 == '\0')) {
    operator_delete(local_50,(local_58 & 0xffffffff) << 3);
  }
  if ((local_64._1_1_ == '\0') && (local_62 == '\0')) {
    operator_delete(local_78.ld.data,(local_78.la[0] & 0xffffffff) << 3);
  }
  return;
}

Assistant:

inline void CLUFactorRational::solveUpdateLeft(Rational* vec)
{
   int i, j, k, end;
   Rational x;
   Rational* val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   VectorRational& lval = l.val;
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   assert(!l.updateType);               /* Forest-Tomlin Updates */

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }
}